

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O2

void __thiscall winmd::reader::database::initialize(database *this)

{
  file_view *this_00;
  table<winmd::reader::Param> *tables_1;
  table<winmd::reader::Property> *this_01;
  table<winmd::reader::MethodDef> *tables_00;
  table<winmd::reader::MemberRef> *this_02;
  table<winmd::reader::Assembly> *tables_13;
  ushort uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  char cVar5;
  byte bVar6;
  table<winmd::reader::GenericParamConstraint> *ptVar7;
  table<winmd::reader::MethodSpec> *ptVar8;
  table<winmd::reader::Module> *ptVar9;
  image_data_directory *piVar10;
  database *this_03;
  table_base *ptVar11;
  table_base *tables_1_00;
  table_base *this_04;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  image_dos_header *piVar15;
  image_nt_headers32 *piVar16;
  image_nt_headers32plus *piVar17;
  image_section_header *piVar18;
  image_section_header *piVar19;
  image_cor20_header *piVar20;
  uint *puVar21;
  unsigned_short *puVar22;
  stream_range *psVar23;
  array<char,_12UL> *paVar24;
  size_t sVar25;
  byte *pbVar26;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  unsigned_long *puVar27;
  table_base *ptVar28;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  uint8_t uVar29;
  int iVar30;
  uint8_t uVar31;
  unsigned_short uVar32;
  uint8_t e;
  image_section_header *last;
  uint32_t uVar33;
  ulong uVar34;
  uint8_t *puVar35;
  bool bVar36;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  uint8_t f;
  table<winmd::reader::Event> *tables_9;
  allocator<char> local_1d9;
  byte_view local_1d8;
  undefined1 local_1c8 [32];
  uint8_t local_1a8;
  table_base *local_198;
  table_base *local_190;
  table_base *local_188;
  table_base *local_180;
  table_base *local_178;
  uint32_t *local_170;
  table_base *local_168;
  table_base *local_160;
  table_base *local_158;
  table_base *local_150;
  table_base *local_148;
  table_base *local_140;
  table_base *local_138;
  table_base *local_130;
  table_base *local_128;
  table_base *local_120;
  table_base *local_118;
  database *local_110;
  uint32_t *local_108;
  table_base *local_100;
  table_base *local_f8;
  table_base *local_f0;
  table_base *local_e8;
  table_base *local_e0;
  table_base *local_d8;
  table_base *local_d0;
  table_base *local_c8;
  table_base *local_c0;
  table_base *local_b8;
  table_base *local_b0;
  table_base *local_a8;
  table_base *local_a0;
  uint32_t *local_98;
  uint32_t *local_90;
  uint32_t *local_88;
  table_base *local_80;
  table_base *local_78;
  table_base *local_70;
  table_base *local_68;
  table_base *local_60;
  bitset<8UL> heap_sizes;
  byte_view tables;
  bitset<64UL> valid_bits;
  
  this_00 = &this->m_view;
  piVar15 = byte_view::as<winmd::impl::image_dos_header>(&this_00->super_byte_view,0);
  if (piVar15->e_signature != 0x5a4d) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,"Invalid DOS signature",(allocator<char> *)&local_1d8);
    impl::throw_invalid((string *)local_1c8);
  }
  uVar33 = piVar15->e_lfanew;
  piVar16 = byte_view::as<winmd::impl::image_nt_headers32>(&this_00->super_byte_view,uVar33);
  uVar1 = (piVar16->FileHeader).NumberOfSections;
  if ((ushort)(uVar1 - 0x65) < 0xff9c) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,"Invalid PE section count",(allocator<char> *)&local_1d8);
    impl::throw_invalid((string *)local_1c8);
  }
  uVar2 = (piVar16->OptionalHeader).Magic;
  local_110 = this;
  if (uVar2 == 0x10b) {
    piVar10 = (piVar16->OptionalHeader).DataDirectory;
    iVar30 = 0xf8;
  }
  else {
    if (uVar2 != 0x20b) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1c8,"Invalid optional header magic value",
                 (allocator<char> *)&local_1d8);
      impl::throw_invalid((string *)local_1c8);
    }
    piVar17 = byte_view::as<winmd::impl::image_nt_headers32plus>(&this_00->super_byte_view,uVar33);
    piVar10 = (piVar17->OptionalHeader).DataDirectory;
    iVar30 = 0x108;
  }
  uVar3 = piVar10[0xe].VirtualAddress;
  piVar18 = byte_view::as<winmd::impl::image_section_header>
                      (&this_00->super_byte_view,uVar33 + iVar30);
  last = piVar18 + uVar1;
  piVar19 = section_from_rva(piVar18,last,uVar3);
  if (piVar19 != last) {
    piVar20 = byte_view::as<winmd::impl::image_cor20_header>
                        (&this_00->super_byte_view,
                         (uVar3 - piVar19->VirtualAddress) + piVar19->PointerToRawData);
    if (piVar20->cb != 0x48) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1c8,"Invalid CLI header",(allocator<char> *)&local_1d8);
      impl::throw_invalid((string *)local_1c8);
    }
    uVar33 = (piVar20->MetaData).VirtualAddress;
    piVar18 = section_from_rva(piVar18,last,uVar33);
    if (piVar18 != last) {
      uVar33 = (uVar33 - piVar18->VirtualAddress) + piVar18->PointerToRawData;
      puVar21 = byte_view::as<unsigned_int>(&this_00->super_byte_view,uVar33);
      if (*puVar21 != 0x424a5342) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1c8,"CLI metadata magic signature not found",
                   (allocator<char> *)&local_1d8);
        impl::throw_invalid((string *)local_1c8);
      }
      puVar21 = byte_view::as<unsigned_int>(&this_00->super_byte_view,uVar33 + 0xc);
      puVar22 = byte_view::as<unsigned_short>(&this_00->super_byte_view,*puVar21 + uVar33 + 0x12);
      uVar32 = *puVar22;
      byte_view::seek(&local_1d8,(uint32_t)this_00);
      tables.m_first = (uint8_t *)0x0;
      tables.m_last = (uint8_t *)0x0;
      do {
        bVar36 = uVar32 == 0;
        uVar32 = uVar32 - 1;
        if (bVar36) {
          pbVar26 = byte_view::as<unsigned_char>(&tables,6);
          heap_sizes.super__Base_bitset<1UL>._M_w._1_7_ = 0;
          heap_sizes.super__Base_bitset<1UL>._M_w._0_1_ = *pbVar26;
          bVar36 = std::bitset<8UL>::test(&heap_sizes,0);
          local_b8 = (table_base *)CONCAT71(extraout_var,bVar36);
          bVar36 = std::bitset<8UL>::test(&heap_sizes,1);
          local_60 = (table_base *)CONCAT71(local_60._1_7_,bVar36);
          bVar36 = std::bitset<8UL>::test(&heap_sizes,2);
          local_c0 = (table_base *)CONCAT71(extraout_var_00,bVar36);
          puVar27 = byte_view::as<unsigned_long>(&tables,8);
          valid_bits.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)*puVar27;
          byte_view::seek((byte_view *)local_1c8,(uint32_t)&tables);
          local_1d8.m_first = (uint8_t *)local_1c8._0_8_;
          local_1d8.m_last = (uint8_t *)local_1c8._8_8_;
          ptVar7 = &local_110->GenericParamConstraint;
          ptVar8 = &local_110->MethodSpec;
          local_118 = (table_base *)&(local_110->GenericParam).super_table_base.m_row_count;
          local_120 = (table_base *)&(local_110->NestedClass).super_table_base.m_row_count;
          local_128 = (table_base *)&(local_110->ManifestResource).super_table_base.m_row_count;
          local_130 = (table_base *)&(local_110->ExportedType).super_table_base.m_row_count;
          local_138 = (table_base *)&(local_110->File).super_table_base.m_row_count;
          local_140 = (table_base *)&(local_110->AssemblyRefOS).super_table_base.m_row_count;
          local_c8 = (table_base *)&(local_110->AssemblyRefProcessor).super_table_base.m_row_count;
          local_d0 = (table_base *)&(local_110->AssemblyRef).super_table_base.m_row_count;
          local_d8 = (table_base *)&(local_110->AssemblyOS).super_table_base.m_row_count;
          local_e0 = (table_base *)&(local_110->AssemblyProcessor).super_table_base.m_row_count;
          local_e8 = (table_base *)&(local_110->Assembly).super_table_base.m_row_count;
          local_f0 = (table_base *)&(local_110->FieldRVA).super_table_base.m_row_count;
          local_f8 = (table_base *)&(local_110->ImplMap).super_table_base.m_row_count;
          local_100 = (table_base *)&(local_110->TypeSpec).super_table_base.m_row_count;
          local_108 = &(local_110->ModuleRef).super_table_base.m_row_count;
          local_68 = (table_base *)&(local_110->MethodImpl).super_table_base.m_row_count;
          local_70 = (table_base *)&(local_110->MethodSemantics).super_table_base.m_row_count;
          local_78 = (table_base *)&(local_110->Property).super_table_base.m_row_count;
          local_80 = (table_base *)&(local_110->PropertyMap).super_table_base.m_row_count;
          local_88 = &(local_110->Event).super_table_base.m_row_count;
          local_148 = (table_base *)&(local_110->EventMap).super_table_base.m_row_count;
          local_90 = &(local_110->StandAloneSig).super_table_base.m_row_count;
          local_98 = &(local_110->FieldLayout).super_table_base.m_row_count;
          local_150 = (table_base *)&(local_110->ClassLayout).super_table_base.m_row_count;
          local_158 = (table_base *)&(local_110->DeclSecurity).super_table_base.m_row_count;
          local_160 = (table_base *)&(local_110->FieldMarshal).super_table_base.m_row_count;
          local_168 = (table_base *)&(local_110->CustomAttribute).super_table_base.m_row_count;
          local_170 = &(local_110->Constant).super_table_base.m_row_count;
          local_178 = (table_base *)&(local_110->MemberRef).super_table_base.m_row_count;
          local_180 = (table_base *)&(local_110->InterfaceImpl).super_table_base.m_row_count;
          local_188 = (table_base *)&(local_110->Param).super_table_base.m_row_count;
          local_190 = (table_base *)&(local_110->MethodDef).super_table_base.m_row_count;
          local_198 = (table_base *)&(local_110->Field).super_table_base.m_row_count;
          local_a0 = (table_base *)&(local_110->TypeDef).super_table_base.m_row_count;
          local_a8 = (table_base *)&(local_110->TypeRef).super_table_base.m_row_count;
          ptVar9 = &local_110->Module;
          for (uVar34 = 0; this_03 = local_110, uVar34 != 0x40; uVar34 = uVar34 + 1) {
            bVar36 = std::bitset<64UL>::test(&valid_bits,uVar34);
            if (bVar36) {
              puVar21 = byte_view::as<unsigned_int>(&local_1d8,0);
              uVar4 = *puVar21;
              byte_view::seek((byte_view *)local_1c8,(uint32_t)&local_1d8);
              local_1d8.m_first = (uint8_t *)local_1c8._0_8_;
              local_1d8.m_last = (uint8_t *)local_1c8._8_8_;
              ptVar28 = (table_base *)&(ptVar9->super_table_base).m_row_count;
              switch(uVar34 & 0xffffffff) {
              case 0:
                break;
              case 1:
                ptVar28 = local_a8;
                break;
              case 2:
                ptVar28 = local_a0;
                break;
              default:
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_1c8,"Unknown metadata table",&local_1d9);
                impl::throw_invalid((string *)local_1c8);
              case 4:
                ptVar28 = local_198;
                break;
              case 6:
                ptVar28 = local_190;
                break;
              case 8:
                ptVar28 = local_188;
                break;
              case 9:
                ptVar28 = local_180;
                break;
              case 10:
                ptVar28 = local_178;
                break;
              case 0xb:
                ptVar28 = (table_base *)local_170;
                break;
              case 0xc:
                ptVar28 = local_168;
                break;
              case 0xd:
                ptVar28 = local_160;
                break;
              case 0xe:
                ptVar28 = local_158;
                break;
              case 0xf:
                ptVar28 = local_150;
                break;
              case 0x10:
                ptVar28 = (table_base *)local_98;
                break;
              case 0x11:
                ptVar28 = (table_base *)local_90;
                break;
              case 0x12:
                ptVar28 = local_148;
                break;
              case 0x14:
                ptVar28 = (table_base *)local_88;
                break;
              case 0x15:
                ptVar28 = local_80;
                break;
              case 0x17:
                ptVar28 = local_78;
                break;
              case 0x18:
                ptVar28 = local_70;
                break;
              case 0x19:
                ptVar28 = local_68;
                break;
              case 0x1a:
                ptVar28 = (table_base *)local_108;
                break;
              case 0x1b:
                ptVar28 = local_100;
                break;
              case 0x1c:
                ptVar28 = local_f8;
                break;
              case 0x1d:
                ptVar28 = local_f0;
                break;
              case 0x20:
                ptVar28 = local_e8;
                break;
              case 0x21:
                ptVar28 = local_e0;
                break;
              case 0x22:
                ptVar28 = local_d8;
                break;
              case 0x23:
                ptVar28 = local_d0;
                break;
              case 0x24:
                ptVar28 = local_c8;
                break;
              case 0x25:
                ptVar28 = local_140;
                break;
              case 0x26:
                ptVar28 = local_138;
                break;
              case 0x27:
                ptVar28 = local_130;
                break;
              case 0x28:
                ptVar28 = local_128;
                break;
              case 0x29:
                ptVar28 = local_120;
                break;
              case 0x2a:
                ptVar28 = local_118;
                break;
              case 0x2b:
                ptVar28 = (table_base *)&(ptVar8->super_table_base).m_row_count;
                break;
              case 0x2c:
                ptVar28 = (table_base *)&(ptVar7->super_table_base).m_row_count;
              }
              *(uint *)ptVar28 = uVar4;
            }
          }
          iVar30 = (int)local_c0 * 2;
          local_108 = (uint32_t *)(ulong)CONCAT31((int3)((uint)iVar30 >> 8),(char)iVar30 + '\x02');
          iVar30 = (int)local_b8 * 2;
          local_150 = (table_base *)
                      CONCAT44(local_150._4_4_,
                               CONCAT31((int3)((uint)iVar30 >> 8),(char)iVar30 + '\x02'));
          local_f0 = &(local_110->TypeDef).super_table_base;
          local_128 = &(local_110->TypeSpec).super_table_base;
          local_1c8._16_8_ = 0;
          local_1c8[0x18] = '\0';
          local_1c8[0x19] = '\0';
          local_1c8[0x1a] = '\0';
          local_1c8[0x1b] = '\0';
          local_1c8[0x1c] = '\0';
          local_1c8[0x1d] = '\0';
          local_1c8[0x1e] = '\0';
          local_1c8[0x1f] = '\0';
          local_1c8._0_8_ = (database *)0x0;
          local_1c8._8_8_ = (uint8_t *)0x0;
          local_1a8 = '\0';
          uVar12 = composite_index_size<winmd::reader::table<winmd::reader::TypeDef>,winmd::reader::table<winmd::reader::TypeRef>,winmd::reader::table<winmd::reader::TypeSpec>>
                             ((table<winmd::reader::TypeDef> *)local_f0,&local_110->TypeRef,
                              (table<winmd::reader::TypeSpec> *)local_128);
          local_190 = (table_base *)CONCAT71(extraout_var_01,uVar12);
          local_138 = &(this_03->Field).super_table_base;
          tables_1 = &this_03->Param;
          this_01 = &this_03->Property;
          uVar12 = composite_index_size<winmd::reader::table<winmd::reader::Field>,winmd::reader::table<winmd::reader::Param>,winmd::reader::table<winmd::reader::Property>>
                             ((table<winmd::reader::Field> *)local_138,tables_1,this_01);
          ptVar11 = local_f0;
          ptVar28 = local_138;
          local_148 = (table_base *)CONCAT71(local_148._1_7_,uVar12);
          tables_00 = &this_03->MethodDef;
          local_f8 = &(this_03->InterfaceImpl).super_table_base;
          this_02 = &this_03->MemberRef;
          local_140 = &(this_03->Module).super_table_base;
          tables_9 = &this_03->Event;
          local_78 = &(this_03->StandAloneSig).super_table_base;
          local_e8 = &(this_03->ModuleRef).super_table_base;
          tables_13 = &this_03->Assembly;
          local_d8 = &(this_03->AssemblyRef).super_table_base;
          local_120 = &(this_03->File).super_table_base;
          local_118 = &(this_03->ExportedType).super_table_base;
          local_d0 = &(this_03->ManifestResource).super_table_base;
          local_c8 = &(this_03->GenericParam).super_table_base;
          local_68 = &(this_03->GenericParamConstraint).super_table_base;
          local_70 = &(this_03->MethodSpec).super_table_base;
          local_130 = &tables_9->super_table_base;
          local_e0 = &tables_13->super_table_base;
          uVar12 = composite_index_size<winmd::reader::table<winmd::reader::MethodDef>,winmd::reader::table<winmd::reader::Field>,winmd::reader::table<winmd::reader::TypeRef>,winmd::reader::table<winmd::reader::TypeDef>,winmd::reader::table<winmd::reader::Param>,winmd::reader::table<winmd::reader::InterfaceImpl>,winmd::reader::table<winmd::reader::MemberRef>,winmd::reader::table<winmd::reader::Module>,winmd::reader::table<winmd::reader::Property>,winmd::reader::table<winmd::reader::Event>,winmd::reader::table<winmd::reader::StandAloneSig>,winmd::reader::table<winmd::reader::ModuleRef>,winmd::reader::table<winmd::reader::TypeSpec>,winmd::reader::table<winmd::reader::Assembly>,winmd::reader::table<winmd::reader::AssemblyRef>,winmd::reader::table<winmd::reader::File>,winmd::reader::table<winmd::reader::ExportedType>,winmd::reader::table<winmd::reader::ManifestResource>,winmd::reader::table<winmd::reader::GenericParam>,winmd::reader::table<winmd::reader::GenericParamConstraint>,winmd::reader::table<winmd::reader::MethodSpec>>
                             (tables_00,(table<winmd::reader::Field> *)local_138,&this_03->TypeRef,
                              (table<winmd::reader::TypeDef> *)local_f0,tables_1,
                              (table<winmd::reader::InterfaceImpl> *)local_f8,this_02,
                              (table<winmd::reader::Module> *)local_140,this_01,tables_9,
                              (table<winmd::reader::StandAloneSig> *)local_78,
                              (table<winmd::reader::ModuleRef> *)local_e8,
                              (table<winmd::reader::TypeSpec> *)local_128,tables_13,
                              (table<winmd::reader::AssemblyRef> *)local_d8,
                              (table<winmd::reader::File> *)local_120,
                              (table<winmd::reader::ExportedType> *)local_118,
                              (table<winmd::reader::ManifestResource> *)local_d0,
                              (table<winmd::reader::GenericParam> *)local_c8,
                              (table<winmd::reader::GenericParamConstraint> *)local_68,
                              (table<winmd::reader::MethodSpec> *)local_70);
          f = (uint8_t)tables_9;
          local_188 = (table_base *)CONCAT71(local_188._1_7_,uVar12);
          local_80 = &tables_1->super_table_base;
          uVar12 = composite_index_size<winmd::reader::table<winmd::reader::Field>,winmd::reader::table<winmd::reader::Param>>
                             ((table<winmd::reader::Field> *)ptVar28,tables_1);
          local_168 = (table_base *)CONCAT71(extraout_var_02,uVar12);
          uVar12 = composite_index_size<winmd::reader::table<winmd::reader::TypeDef>,winmd::reader::table<winmd::reader::MethodDef>,winmd::reader::table<winmd::reader::Assembly>>
                             ((table<winmd::reader::TypeDef> *)ptVar11,tables_00,tables_13);
          tables_1_00 = local_e8;
          local_180 = (table_base *)CONCAT71(local_180._1_7_,uVar12);
          uVar12 = composite_index_size<winmd::reader::table<winmd::reader::TypeDef>,winmd::reader::table<winmd::reader::TypeRef>,winmd::reader::table<winmd::reader::ModuleRef>,winmd::reader::table<winmd::reader::MethodDef>,winmd::reader::table<winmd::reader::TypeSpec>>
                             ((table<winmd::reader::TypeDef> *)ptVar11,&this_03->TypeRef,
                              (table<winmd::reader::ModuleRef> *)local_e8,tables_00,
                              (table<winmd::reader::TypeSpec> *)local_128);
          local_160 = (table_base *)CONCAT71(local_160._1_7_,uVar12);
          uVar12 = composite_index_size<winmd::reader::table<winmd::reader::Event>,winmd::reader::table<winmd::reader::Property>>
                             ((table<winmd::reader::Event> *)local_130,this_01);
          local_98 = (uint32_t *)CONCAT71(local_98._1_7_,uVar12);
          uVar12 = composite_index_size<winmd::reader::table<winmd::reader::MethodDef>,winmd::reader::table<winmd::reader::MemberRef>>
                             (tables_00,this_02);
          local_90 = (uint32_t *)CONCAT71(local_90._1_7_,uVar12);
          uVar12 = composite_index_size<winmd::reader::table<winmd::reader::Field>,winmd::reader::table<winmd::reader::MethodDef>>
                             ((table<winmd::reader::Field> *)ptVar28,tables_00);
          this_04 = local_d8;
          local_158 = (table_base *)CONCAT71(local_158._1_7_,uVar12);
          uVar12 = composite_index_size<winmd::reader::table<winmd::reader::File>,winmd::reader::table<winmd::reader::AssemblyRef>,winmd::reader::table<winmd::reader::ExportedType>>
                             ((table<winmd::reader::File> *)local_120,
                              (table<winmd::reader::AssemblyRef> *)local_d8,
                              (table<winmd::reader::ExportedType> *)local_118);
          local_178 = (table_base *)CONCAT71(local_178._1_7_,uVar12);
          uVar12 = composite_index_size<winmd::reader::table<winmd::reader::MethodDef>,winmd::reader::table<winmd::reader::MemberRef>,winmd::reader::table_base,winmd::reader::table_base,winmd::reader::table_base>
                             (tables_00,this_02,(table_base *)local_1c8,(table_base *)local_1c8,
                              (table_base *)local_1c8);
          local_198 = (table_base *)CONCAT71(local_198._1_7_,uVar12);
          uVar12 = composite_index_size<winmd::reader::table<winmd::reader::Module>,winmd::reader::table<winmd::reader::ModuleRef>,winmd::reader::table<winmd::reader::AssemblyRef>,winmd::reader::table<winmd::reader::TypeRef>>
                             ((table<winmd::reader::Module> *)local_140,
                              (table<winmd::reader::ModuleRef> *)tables_1_00,
                              (table<winmd::reader::AssemblyRef> *)this_04,&this_03->TypeRef);
          local_88 = (uint32_t *)CONCAT71(local_88._1_7_,uVar12);
          local_100 = &tables_00->super_table_base;
          uVar12 = composite_index_size<winmd::reader::table<winmd::reader::TypeDef>,winmd::reader::table<winmd::reader::MethodDef>>
                             ((table<winmd::reader::TypeDef> *)ptVar11,tables_00);
          local_170 = (uint32_t *)CONCAT71(local_170._1_7_,uVar12);
          e = (char)local_b8 * '\x02' + '\x02';
          uVar31 = (char)local_c0 * '\x02' + '\x02';
          table_base::set_columns(local_e0,'\x04','\b','\x04',uVar31,e,f);
          ptVar28 = &(this_03->AssemblyOS).super_table_base;
          (this_03->AssemblyOS).super_table_base.m_row_size = '\f';
          (ptVar28->m_columns)._M_elems[0].offset = '\0';
          (ptVar28->m_columns)._M_elems[0].size = '\x04';
          (this_03->AssemblyOS).super_table_base.m_columns._M_elems[1].offset = '\x04';
          *(undefined2 *)&(this_03->AssemblyOS).super_table_base.m_columns._M_elems[1].size = 0x804;
          (this_03->AssemblyOS).super_table_base.m_columns._M_elems[2].size = '\x04';
          (this_03->AssemblyProcessor).super_table_base.m_row_size = '\x04';
          (this_03->AssemblyProcessor).super_table_base.m_columns._M_elems[0].offset = '\0';
          (this_03->AssemblyProcessor).super_table_base.m_columns._M_elems[0].size = '\x04';
          table_base::set_columns(this_04,'\b','\x04',uVar31,e,e,f);
          cVar5 = (0xffff < (this_03->AssemblyRef).super_table_base.m_row_count) * '\x02';
          (this_03->AssemblyRefOS).super_table_base.m_row_size = cVar5 + '\x0e';
          ptVar28 = &(this_03->AssemblyRefOS).super_table_base;
          ptVar11 = &(this_03->AssemblyRefOS).super_table_base;
          (ptVar28->m_columns)._M_elems[0].offset = '\0';
          (ptVar28->m_columns)._M_elems[0].size = '\x04';
          (ptVar11->m_columns)._M_elems[1].offset = '\x04';
          (ptVar11->m_columns)._M_elems[1].size = '\x04';
          ptVar28 = &(this_03->AssemblyRefOS).super_table_base;
          (ptVar28->m_columns)._M_elems[2].offset = '\b';
          (ptVar28->m_columns)._M_elems[2].size = '\x04';
          (this_03->AssemblyRefOS).super_table_base.m_columns._M_elems[3].offset = '\f';
          (this_03->AssemblyRefOS).super_table_base.m_columns._M_elems[3].size = cVar5 + '\x02';
          (this_03->AssemblyRefProcessor).super_table_base.m_row_size = cVar5 + '\x06';
          (this_03->AssemblyRefProcessor).super_table_base.m_columns._M_elems[0].offset = '\0';
          (this_03->AssemblyRefProcessor).super_table_base.m_columns._M_elems[0].size = '\x04';
          (this_03->AssemblyRefProcessor).super_table_base.m_columns._M_elems[1].offset = '\x04';
          (this_03->AssemblyRefProcessor).super_table_base.m_columns._M_elems[1].size =
               cVar5 + '\x02';
          bVar6 = (0xffff < (this_03->TypeDef).super_table_base.m_row_count) * '\x02';
          (this_03->ClassLayout).super_table_base.m_row_size = bVar6 | 8;
          ptVar28 = &(this_03->ClassLayout).super_table_base;
          ptVar11 = &(this_03->ClassLayout).super_table_base;
          (ptVar28->m_columns)._M_elems[0].offset = '\0';
          (ptVar28->m_columns)._M_elems[0].size = '\x02';
          (ptVar11->m_columns)._M_elems[1].offset = '\x02';
          (ptVar11->m_columns)._M_elems[1].size = '\x04';
          (this_03->ClassLayout).super_table_base.m_columns._M_elems[2].offset = '\x06';
          (this_03->ClassLayout).super_table_base.m_columns._M_elems[2].size = bVar6 + 2;
          local_b8 = &(this_03->Constant).super_table_base;
          table_base::set_columns(local_b8,'\x02',(uint8_t)local_148,uVar31,'\0','\0',f);
          local_c0 = &(this_03->CustomAttribute).super_table_base;
          table_base::set_columns(local_c0,(uint8_t)local_188,(uint8_t)local_198,uVar31,'\0','\0',f)
          ;
          local_148 = &(this_03->DeclSecurity).super_table_base;
          table_base::set_columns(local_148,'\x02',(uint8_t)local_180,uVar31,'\0','\0',f);
          uVar12 = (0xffff < (this_03->TypeDef).super_table_base.m_row_count) * '\x02' + '\x02';
          uVar29 = (0xffff < (this_03->Event).super_table_base.m_row_count) * '\x02' + '\x02';
          (this_03->EventMap).super_table_base.m_row_size = uVar29 + uVar12;
          (this_03->EventMap).super_table_base.m_columns._M_elems[0].offset = '\0';
          (this_03->EventMap).super_table_base.m_columns._M_elems[0].size = uVar12;
          (this_03->EventMap).super_table_base.m_columns._M_elems[1].offset = uVar12;
          (this_03->EventMap).super_table_base.m_columns._M_elems[1].size = uVar29;
          uVar13 = (uint8_t)local_190;
          uVar34 = (ulong)local_190 & 0xff;
          table_base::set_columns(local_130,'\x02',e,uVar13,'\0','\0',f);
          local_b0 = (table_base *)CONCAT44(local_b0._4_4_,(uint)(byte)local_178);
          table_base::set_columns(local_118,'\x04','\x04',e,e,(byte)local_178,f);
          table_base::set_columns(local_138,'\x02',e,uVar31,'\0','\0',f);
          cVar5 = (0xffff < (this_03->Field).super_table_base.m_row_count) * '\x02';
          uVar12 = cVar5 + '\x02';
          uVar14 = cVar5 + '\x06';
          (this_03->FieldLayout).super_table_base.m_row_size = uVar14;
          (this_03->FieldLayout).super_table_base.m_columns._M_elems[0].offset = '\0';
          (this_03->FieldLayout).super_table_base.m_columns._M_elems[0].size = '\x04';
          (this_03->FieldLayout).super_table_base.m_columns._M_elems[1].offset = '\x04';
          (this_03->FieldLayout).super_table_base.m_columns._M_elems[1].size = uVar12;
          uVar29 = (uint8_t)local_168;
          (this_03->FieldMarshal).super_table_base.m_row_size = uVar29 + (uint8_t)local_108;
          (this_03->FieldMarshal).super_table_base.m_columns._M_elems[0].offset = '\0';
          (this_03->FieldMarshal).super_table_base.m_columns._M_elems[0].size = uVar29;
          (this_03->FieldMarshal).super_table_base.m_columns._M_elems[1].offset = uVar29;
          (this_03->FieldMarshal).super_table_base.m_columns._M_elems[1].size = (uint8_t)local_108;
          (this_03->FieldRVA).super_table_base.m_row_size = uVar14;
          (this_03->FieldRVA).super_table_base.m_columns._M_elems[0].offset = '\0';
          (this_03->FieldRVA).super_table_base.m_columns._M_elems[0].size = '\x04';
          (this_03->FieldRVA).super_table_base.m_columns._M_elems[1].offset = '\x04';
          (this_03->FieldRVA).super_table_base.m_columns._M_elems[1].size = uVar12;
          table_base::set_columns(local_120,'\x04',e,uVar31,'\0','\0',f);
          table_base::set_columns(local_c8,'\x02','\x02',(uint8_t)local_170,e,'\0',f);
          uVar12 = (0xffff < (this_03->GenericParam).super_table_base.m_row_count) * '\x02' + '\x02'
          ;
          (this_03->GenericParamConstraint).super_table_base.m_row_size = uVar12 + uVar13;
          (this_03->GenericParamConstraint).super_table_base.m_columns._M_elems[0].offset = '\0';
          (this_03->GenericParamConstraint).super_table_base.m_columns._M_elems[0].size = uVar12;
          if (uVar13 != '\0') {
            (this_03->GenericParamConstraint).super_table_base.m_columns._M_elems[1].offset = uVar12
            ;
            (this_03->GenericParamConstraint).super_table_base.m_columns._M_elems[1].size = uVar13;
          }
          uVar12 = (uint8_t)local_150;
          local_170 = (uint32_t *)uVar34;
          local_150 = &(this_03->ImplMap).super_table_base;
          table_base::set_columns
                    (&(this_03->ImplMap).super_table_base,'\x02',(uint8_t)local_158,uVar12,
                     (0xffff < (this_03->ModuleRef).super_table_base.m_row_count) * '\x02' + '\x02',
                     '\0',f);
          uVar29 = (0xffff < (this_03->TypeDef).super_table_base.m_row_count) * '\x02' + '\x02';
          (this_03->InterfaceImpl).super_table_base.m_row_size = uVar29 + uVar13;
          (this_03->InterfaceImpl).super_table_base.m_columns._M_elems[0].offset = '\0';
          (this_03->InterfaceImpl).super_table_base.m_columns._M_elems[0].size = uVar29;
          if (uVar13 != '\0') {
            (this_03->InterfaceImpl).super_table_base.m_columns._M_elems[1].offset = uVar29;
            (this_03->InterfaceImpl).super_table_base.m_columns._M_elems[1].size = uVar13;
          }
          local_188 = &(this_03->FieldRVA).super_table_base;
          local_a8 = &(this_03->FieldMarshal).super_table_base;
          local_198 = &(this_03->FieldLayout).super_table_base;
          local_190 = &(this_03->EventMap).super_table_base;
          local_a0 = &(this_03->ClassLayout).super_table_base;
          local_168 = &(this_03->AssemblyRefProcessor).super_table_base;
          local_158 = &(this_03->AssemblyRefOS).super_table_base;
          local_180 = &(this_03->AssemblyProcessor).super_table_base;
          local_178 = &(this_03->AssemblyOS).super_table_base;
          table_base::set_columns(local_d0,'\x04','\x04',uVar12,(uint8_t)local_b0,'\0',f);
          uVar13 = (uint8_t)local_108;
          table_base::set_columns
                    (&this_02->super_table_base,(uint8_t)local_160,uVar12,uVar13,'\0','\0',f);
          table_base::set_columns(local_100,'\x04','\x02','\x02',uVar12,uVar13,f);
          local_160 = &(this_03->MethodImpl).super_table_base;
          uVar29 = (uint8_t)local_90;
          table_base::set_columns
                    (local_160,
                     (0xffff < (this_03->TypeDef).super_table_base.m_row_count) * '\x02' + '\x02',
                     (uint8_t)local_90,(uint8_t)local_90,'\0','\0',f);
          local_b0 = &(this_03->MethodSemantics).super_table_base;
          table_base::set_columns
                    (local_b0,'\x02',
                     (0xffff < (this_03->MethodDef).super_table_base.m_row_count) * '\x02' + '\x02',
                     (uint8_t)local_98,'\0','\0',f);
          (this_03->MethodSpec).super_table_base.m_row_size = uVar29 + uVar13;
          (this_03->MethodSpec).super_table_base.m_columns._M_elems[0].offset = '\0';
          (this_03->MethodSpec).super_table_base.m_columns._M_elems[0].size = uVar29;
          (this_03->MethodSpec).super_table_base.m_columns._M_elems[1].offset = uVar29;
          (this_03->MethodSpec).super_table_base.m_columns._M_elems[1].size = uVar13;
          uVar29 = (char)local_60 * '\x02' + '\x02';
          table_base::set_columns(local_140,'\x02',uVar12,uVar29,uVar29,uVar29,f);
          (this_03->ModuleRef).super_table_base.m_row_size = uVar12;
          (this_03->ModuleRef).super_table_base.m_columns._M_elems[0].offset = '\0';
          (this_03->ModuleRef).super_table_base.m_columns._M_elems[0].size = uVar12;
          local_60 = &(this_03->NestedClass).super_table_base;
          uVar29 = (0xffff < (this_03->TypeDef).super_table_base.m_row_count) * '\x02' + '\x02';
          (this_03->NestedClass).super_table_base.m_row_size = uVar29 * '\x02';
          (this_03->NestedClass).super_table_base.m_columns._M_elems[0].offset = '\0';
          (this_03->NestedClass).super_table_base.m_columns._M_elems[0].size = uVar29;
          (this_03->NestedClass).super_table_base.m_columns._M_elems[1].offset = uVar29;
          (this_03->NestedClass).super_table_base.m_columns._M_elems[1].size = uVar29;
          (this_03->Param).super_table_base.m_row_size = uVar12 + '\x04';
          ptVar28 = &(this_03->Param).super_table_base;
          ptVar11 = &(this_03->Param).super_table_base;
          (ptVar28->m_columns)._M_elems[0].offset = '\0';
          (ptVar28->m_columns)._M_elems[0].size = '\x02';
          (ptVar11->m_columns)._M_elems[1].offset = '\x02';
          (ptVar11->m_columns)._M_elems[1].size = '\x02';
          (this_03->Param).super_table_base.m_columns._M_elems[2].offset = '\x04';
          (this_03->Param).super_table_base.m_columns._M_elems[2].size = uVar12;
          table_base::set_columns(&this_01->super_table_base,'\x02',uVar12,uVar13,'\0','\0',f);
          ptVar28 = local_f0;
          uVar29 = (0xffff < (this_03->TypeDef).super_table_base.m_row_count) * '\x02' + '\x02';
          uVar31 = (0xffff < (this_03->Property).super_table_base.m_row_count) * '\x02' + '\x02';
          (this_03->PropertyMap).super_table_base.m_row_size = uVar31 + uVar29;
          (this_03->PropertyMap).super_table_base.m_columns._M_elems[0].offset = '\0';
          (this_03->PropertyMap).super_table_base.m_columns._M_elems[0].size = uVar29;
          (this_03->PropertyMap).super_table_base.m_columns._M_elems[1].offset = uVar29;
          (this_03->PropertyMap).super_table_base.m_columns._M_elems[1].size = uVar31;
          (this_03->StandAloneSig).super_table_base.m_row_size = uVar13;
          (this_03->StandAloneSig).super_table_base.m_columns._M_elems[0].offset = '\0';
          (this_03->StandAloneSig).super_table_base.m_columns._M_elems[0].size = uVar13;
          table_base::set_columns
                    (local_f0,'\x04',uVar12,uVar12,(uint8_t)local_170,
                     (0xffff < (this_03->Field).super_table_base.m_row_count) * '\x02' + '\x02',f);
          table_base::set_columns((table_base *)this_03,(uint8_t)local_88,uVar12,uVar12,'\0','\0',f)
          ;
          (this_03->TypeSpec).super_table_base.m_row_size = uVar13;
          (this_03->TypeSpec).super_table_base.m_columns._M_elems[0].offset = '\0';
          (this_03->TypeSpec).super_table_base.m_columns._M_elems[0].size = uVar13;
          table_base::set_data(local_140,&local_1d8);
          table_base::set_data((table_base *)this_03,&local_1d8);
          table_base::set_data(ptVar28,&local_1d8);
          table_base::set_data(local_138,&local_1d8);
          table_base::set_data(local_100,&local_1d8);
          table_base::set_data(local_80,&local_1d8);
          table_base::set_data(local_f8,&local_1d8);
          table_base::set_data(&this_02->super_table_base,&local_1d8);
          table_base::set_data(local_b8,&local_1d8);
          table_base::set_data(local_c0,&local_1d8);
          table_base::set_data(local_a8,&local_1d8);
          table_base::set_data(local_148,&local_1d8);
          table_base::set_data(local_a0,&local_1d8);
          table_base::set_data(local_198,&local_1d8);
          table_base::set_data(local_78,&local_1d8);
          table_base::set_data(local_190,&local_1d8);
          table_base::set_data(local_130,&local_1d8);
          table_base::set_data(&(this_03->PropertyMap).super_table_base,&local_1d8);
          table_base::set_data(&this_01->super_table_base,&local_1d8);
          table_base::set_data(local_b0,&local_1d8);
          table_base::set_data(local_160,&local_1d8);
          table_base::set_data(local_e8,&local_1d8);
          table_base::set_data(local_128,&local_1d8);
          table_base::set_data(local_150,&local_1d8);
          table_base::set_data(local_188,&local_1d8);
          table_base::set_data(local_e0,&local_1d8);
          table_base::set_data(local_180,&local_1d8);
          table_base::set_data(local_178,&local_1d8);
          table_base::set_data(local_d8,&local_1d8);
          table_base::set_data(local_168,&local_1d8);
          table_base::set_data(local_158,&local_1d8);
          table_base::set_data(local_120,&local_1d8);
          table_base::set_data(local_118,&local_1d8);
          table_base::set_data(local_d0,&local_1d8);
          table_base::set_data(local_60,&local_1d8);
          table_base::set_data(local_c8,&local_1d8);
          table_base::set_data(local_70,&local_1d8);
          table_base::set_data(local_68,&local_1d8);
          return;
        }
        psVar23 = byte_view::as<winmd::reader::database::stream_range>(&local_1d8,0);
        uVar3 = psVar23->offset;
        uVar4 = psVar23->size;
        paVar24 = byte_view::as<std::array<char,12ul>>(&local_1d8,8);
        heap_sizes.super__Base_bitset<1UL>._M_w = *(_Base_bitset<1UL> *)paVar24->_M_elems;
        sVar25 = strlen((char *)&heap_sizes);
        __x._M_str = (char *)&heap_sizes;
        __x._M_len = sVar25;
        __y._M_str = "#Strings";
        __y._M_len = 8;
        bVar36 = std::operator==(__x,__y);
        if (bVar36) {
          byte_view::check_available(&this_00->super_byte_view,uVar4 + uVar3 + uVar33);
          puVar35 = (local_110->m_view).super_byte_view.m_first + (uVar3 + uVar33);
          (local_110->m_strings).m_first = puVar35;
          (local_110->m_strings).m_last = puVar35 + uVar4;
        }
        else {
          sVar25 = strlen((char *)&heap_sizes);
          __x_00._M_str = (char *)&heap_sizes;
          __x_00._M_len = sVar25;
          __y_00._M_str = "#Blob";
          __y_00._M_len = 5;
          bVar36 = std::operator==(__x_00,__y_00);
          if (bVar36) {
            byte_view::check_available(&this_00->super_byte_view,uVar4 + uVar3 + uVar33);
            puVar35 = (local_110->m_view).super_byte_view.m_first + (uVar3 + uVar33);
            (local_110->m_blobs).m_first = puVar35;
            (local_110->m_blobs).m_last = puVar35 + uVar4;
          }
          else {
            sVar25 = strlen((char *)&heap_sizes);
            __x_01._M_str = (char *)&heap_sizes;
            __x_01._M_len = sVar25;
            __y_01._M_str = "#GUID";
            __y_01._M_len = 5;
            bVar36 = std::operator==(__x_01,__y_01);
            if (bVar36) {
              byte_view::check_available(&this_00->super_byte_view,uVar4 + uVar3 + uVar33);
              puVar35 = (local_110->m_view).super_byte_view.m_first + (uVar3 + uVar33);
              (local_110->m_guids).m_first = puVar35;
              (local_110->m_guids).m_last = puVar35 + uVar4;
            }
            else {
              sVar25 = strlen((char *)&heap_sizes);
              __x_02._M_str = (char *)&heap_sizes;
              __x_02._M_len = sVar25;
              __y_02._M_str = "#~";
              __y_02._M_len = 2;
              bVar36 = std::operator==(__x_02,__y_02);
              if (bVar36) {
                byte_view::check_available(&this_00->super_byte_view,uVar4 + uVar3 + uVar33);
                tables.m_first = (this_00->super_byte_view).m_first + (uVar3 + uVar33);
                tables.m_last = tables.m_first + uVar4;
              }
              else {
                sVar25 = strlen((char *)&heap_sizes);
                __x_03._M_str = (char *)&heap_sizes;
                __x_03._M_len = sVar25;
                __y_03._M_str = "#US";
                __y_03._M_len = 3;
                bVar36 = std::operator!=(__x_03,__y_03);
                if (bVar36) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_1c8,"Unknown metadata stream",
                             (allocator<char> *)&valid_bits);
                  impl::throw_invalid((string *)local_1c8);
                }
              }
            }
          }
        }
        strlen((char *)&heap_sizes);
        byte_view::seek((byte_view *)local_1c8,(uint32_t)&local_1d8);
      } while( true );
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,"PE section containing CLI metadata not found",
               (allocator<char> *)&local_1d8);
    impl::throw_invalid((string *)local_1c8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"PE section containing CLI header not found",
             (allocator<char> *)&local_1d8);
  impl::throw_invalid((string *)local_1c8);
}

Assistant:

void initialize()
        {
            auto dos = m_view.as<impl::image_dos_header>();

            if (dos.e_signature != 0x5A4D) // IMAGE_DOS_SIGNATURE
            {
                impl::throw_invalid("Invalid DOS signature");
            }

            auto pe = m_view.as<impl::image_nt_headers32>(dos.e_lfanew);

            if (pe.FileHeader.NumberOfSections == 0 || pe.FileHeader.NumberOfSections > 100)
            {
                impl::throw_invalid("Invalid PE section count");
            }

            impl::image_section_header const* sections{};
            uint32_t com_virtual_address{};
            if (pe.OptionalHeader.Magic == 0x10B) // PE32
            {
                com_virtual_address = pe.OptionalHeader.DataDirectory[14].VirtualAddress; // IMAGE_DIRECTORY_ENTRY_COM_DESCRIPTOR
                sections = &m_view.as<impl::image_section_header>(dos.e_lfanew + sizeof(impl::image_nt_headers32));
            }
            else if (pe.OptionalHeader.Magic == 0x20B) // PE32+
            {
                auto pe_plus = m_view.as<impl::image_nt_headers32plus>(dos.e_lfanew);
                com_virtual_address = pe_plus.OptionalHeader.DataDirectory[14].VirtualAddress; // IMAGE_DIRECTORY_ENTRY_COM_DESCRIPTOR
                sections = &m_view.as<impl::image_section_header>(dos.e_lfanew + sizeof(impl::image_nt_headers32plus));
            }
            else
            {
                impl::throw_invalid("Invalid optional header magic value");
            }
            auto sections_end = sections + pe.FileHeader.NumberOfSections;
            auto section = section_from_rva(sections, sections_end, com_virtual_address);

            if (section == sections_end)
            {
                impl::throw_invalid("PE section containing CLI header not found");
            }

            auto offset = offset_from_rva(*section, com_virtual_address);

            auto cli = m_view.as<impl::image_cor20_header>(offset);

            if (cli.cb != sizeof(impl::image_cor20_header))
            {
                impl::throw_invalid("Invalid CLI header");
            }

            section = section_from_rva(sections, sections_end, cli.MetaData.VirtualAddress);

            if (section == sections_end)
            {
                impl::throw_invalid("PE section containing CLI metadata not found");
            }

            offset = offset_from_rva(*section, cli.MetaData.VirtualAddress);

            if (m_view.as<uint32_t>(offset) != 0x424a5342)
            {
                impl::throw_invalid("CLI metadata magic signature not found");
            }

            auto version_length = m_view.as<uint32_t>(offset + 12);
            auto stream_count = m_view.as<uint16_t>(offset + version_length + 18);
            auto view = m_view.seek(offset + version_length + 20);
            byte_view tables;

            for (uint16_t i{}; i < stream_count; ++i)
            {
                auto stream = view.as<stream_range>();
                auto name = view.as<std::array<char, 12>>(8);

                if (name.data() == "#Strings"sv)
                {
                    m_strings = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() == "#Blob"sv)
                {
                    m_blobs = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() == "#GUID"sv)
                {
                    m_guids = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() == "#~"sv)
                {
                    tables = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() != "#US"sv)
                {
                    impl::throw_invalid("Unknown metadata stream");
                }

                view = view.seek(stream_offset(name.data()));
            }

            std::bitset<8> const heap_sizes{ tables.as<uint8_t>(6) };
            uint8_t const string_index_size = heap_sizes.test(0) ? 4 : 2;
            uint8_t const guid_index_size = heap_sizes.test(1) ? 4 : 2;
            uint8_t const blob_index_size = heap_sizes.test(2) ? 4 : 2;

            std::bitset<64> const valid_bits{ tables.as<uint64_t>(8) };
            view = tables.seek(24);

            for (uint32_t i{}; i < 64; ++i)
            {
                if (!valid_bits.test(i))
                {
                    continue;
                }

                auto row_count = view.as<uint32_t>();
                view = view.seek(4);

                switch (i)
                {
                case 0x00: Module.set_row_count(row_count); break;
                case 0x01: TypeRef.set_row_count(row_count); break;
                case 0x02: TypeDef.set_row_count(row_count); break;
                case 0x04: Field.set_row_count(row_count); break;
                case 0x06: MethodDef.set_row_count(row_count); break;
                case 0x08: Param.set_row_count(row_count); break;
                case 0x09: InterfaceImpl.set_row_count(row_count); break;
                case 0x0a: MemberRef.set_row_count(row_count); break;
                case 0x0b: Constant.set_row_count(row_count); break;
                case 0x0c: CustomAttribute.set_row_count(row_count); break;
                case 0x0d: FieldMarshal.set_row_count(row_count); break;
                case 0x0e: DeclSecurity.set_row_count(row_count); break;
                case 0x0f: ClassLayout.set_row_count(row_count); break;
                case 0x10: FieldLayout.set_row_count(row_count); break;
                case 0x11: StandAloneSig.set_row_count(row_count); break;
                case 0x12: EventMap.set_row_count(row_count); break;
                case 0x14: Event.set_row_count(row_count); break;
                case 0x15: PropertyMap.set_row_count(row_count); break;
                case 0x17: Property.set_row_count(row_count); break;
                case 0x18: MethodSemantics.set_row_count(row_count); break;
                case 0x19: MethodImpl.set_row_count(row_count); break;
                case 0x1a: ModuleRef.set_row_count(row_count); break;
                case 0x1b: TypeSpec.set_row_count(row_count); break;
                case 0x1c: ImplMap.set_row_count(row_count); break;
                case 0x1d: FieldRVA.set_row_count(row_count); break;
                case 0x20: Assembly.set_row_count(row_count); break;
                case 0x21: AssemblyProcessor.set_row_count(row_count); break;
                case 0x22: AssemblyOS.set_row_count(row_count); break;
                case 0x23: AssemblyRef.set_row_count(row_count); break;
                case 0x24: AssemblyRefProcessor.set_row_count(row_count); break;
                case 0x25: AssemblyRefOS.set_row_count(row_count); break;
                case 0x26: File.set_row_count(row_count); break;
                case 0x27: ExportedType.set_row_count(row_count); break;
                case 0x28: ManifestResource.set_row_count(row_count); break;
                case 0x29: NestedClass.set_row_count(row_count); break;
                case 0x2a: GenericParam.set_row_count(row_count); break;
                case 0x2b: MethodSpec.set_row_count(row_count); break;
                case 0x2c: GenericParamConstraint.set_row_count(row_count); break;
                default: impl::throw_invalid("Unknown metadata table");
                };
            }

            table_base const empty_table{ nullptr };

            auto const TypeDefOrRef = composite_index_size(TypeDef, TypeRef, TypeSpec);
            auto const HasConstant = composite_index_size(Field, Param, Property);
            auto const HasCustomAttribute = composite_index_size(MethodDef, Field, TypeRef, TypeDef, Param, InterfaceImpl, MemberRef, Module, Property, Event, StandAloneSig, ModuleRef, TypeSpec, Assembly, AssemblyRef, File, ExportedType, ManifestResource, GenericParam, GenericParamConstraint, MethodSpec);
            auto const HasFieldMarshal = composite_index_size(Field, Param);
            auto const HasDeclSecurity = composite_index_size(TypeDef, MethodDef, Assembly);
            auto const MemberRefParent = composite_index_size(TypeDef, TypeRef, ModuleRef, MethodDef, TypeSpec);
            auto const HasSemantics = composite_index_size(Event, Property);
            auto const MethodDefOrRef = composite_index_size(MethodDef, MemberRef);
            auto const MemberForwarded = composite_index_size(Field, MethodDef);
            auto const Implementation = composite_index_size(File, AssemblyRef, ExportedType);
            auto const CustomAttributeType = composite_index_size(MethodDef, MemberRef, empty_table, empty_table, empty_table);
            auto const ResolutionScope = composite_index_size(Module, ModuleRef, AssemblyRef, TypeRef);
            auto const TypeOrMethodDef = composite_index_size(TypeDef, MethodDef);

            Assembly.set_columns(4, 8, 4, blob_index_size, string_index_size, string_index_size);
            AssemblyOS.set_columns(4, 4, 4);
            AssemblyProcessor.set_columns(4);
            AssemblyRef.set_columns(8, 4, blob_index_size, string_index_size, string_index_size, blob_index_size);
            AssemblyRefOS.set_columns(4, 4, 4, AssemblyRef.index_size());
            AssemblyRefProcessor.set_columns(4, AssemblyRef.index_size());
            ClassLayout.set_columns(2, 4, TypeDef.index_size());
            Constant.set_columns(2, HasConstant, blob_index_size);
            CustomAttribute.set_columns(HasCustomAttribute, CustomAttributeType, blob_index_size);
            DeclSecurity.set_columns(2, HasDeclSecurity, blob_index_size);
            EventMap.set_columns(TypeDef.index_size(), Event.index_size());
            Event.set_columns(2, string_index_size, TypeDefOrRef);
            ExportedType.set_columns(4, 4, string_index_size, string_index_size, Implementation);
            Field.set_columns(2, string_index_size, blob_index_size);
            FieldLayout.set_columns(4, Field.index_size());
            FieldMarshal.set_columns(HasFieldMarshal, blob_index_size);
            FieldRVA.set_columns(4, Field.index_size());
            File.set_columns(4, string_index_size, blob_index_size);
            GenericParam.set_columns(2, 2, TypeOrMethodDef, string_index_size);
            GenericParamConstraint.set_columns(GenericParam.index_size(), TypeDefOrRef);
            ImplMap.set_columns(2, MemberForwarded, string_index_size, ModuleRef.index_size());
            InterfaceImpl.set_columns(TypeDef.index_size(), TypeDefOrRef);
            ManifestResource.set_columns(4, 4, string_index_size, Implementation);
            MemberRef.set_columns(MemberRefParent, string_index_size, blob_index_size);
            MethodDef.set_columns(4, 2, 2, string_index_size, blob_index_size, Param.index_size());
            MethodImpl.set_columns(TypeDef.index_size(), MethodDefOrRef, MethodDefOrRef);
            MethodSemantics.set_columns(2, MethodDef.index_size(), HasSemantics);
            MethodSpec.set_columns(MethodDefOrRef, blob_index_size);
            Module.set_columns(2, string_index_size, guid_index_size, guid_index_size, guid_index_size);
            ModuleRef.set_columns(string_index_size);
            NestedClass.set_columns(TypeDef.index_size(), TypeDef.index_size());
            Param.set_columns(2, 2, string_index_size);
            Property.set_columns(2, string_index_size, blob_index_size);
            PropertyMap.set_columns(TypeDef.index_size(), Property.index_size());
            StandAloneSig.set_columns(blob_index_size);
            TypeDef.set_columns(4, string_index_size, string_index_size, TypeDefOrRef, Field.index_size(), MethodDef.index_size());
            TypeRef.set_columns(ResolutionScope, string_index_size, string_index_size);
            TypeSpec.set_columns(blob_index_size);

            Module.set_data(view);
            TypeRef.set_data(view);
            TypeDef.set_data(view);
            Field.set_data(view);
            MethodDef.set_data(view);
            Param.set_data(view);
            InterfaceImpl.set_data(view);
            MemberRef.set_data(view);
            Constant.set_data(view);
            CustomAttribute.set_data(view);
            FieldMarshal.set_data(view);
            DeclSecurity.set_data(view);
            ClassLayout.set_data(view);
            FieldLayout.set_data(view);
            StandAloneSig.set_data(view);
            EventMap.set_data(view);
            Event.set_data(view);
            PropertyMap.set_data(view);
            Property.set_data(view);
            MethodSemantics.set_data(view);
            MethodImpl.set_data(view);
            ModuleRef.set_data(view);
            TypeSpec.set_data(view);
            ImplMap.set_data(view);
            FieldRVA.set_data(view);
            Assembly.set_data(view);
            AssemblyProcessor.set_data(view);
            AssemblyOS.set_data(view);
            AssemblyRef.set_data(view);
            AssemblyRefProcessor.set_data(view);
            AssemblyRefOS.set_data(view);
            File.set_data(view);
            ExportedType.set_data(view);
            ManifestResource.set_data(view);
            NestedClass.set_data(view);
            GenericParam.set_data(view);
            MethodSpec.set_data(view);
            GenericParamConstraint.set_data(view);
        }